

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::half>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *result)

{
  bool bVar1;
  allocator local_79;
  string local_78;
  half local_56;
  char local_53;
  char local_52;
  allocator local_51;
  undefined1 local_50 [2];
  half value_1;
  char nc;
  char c;
  half local_2a;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *pvStack_28;
  half value;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  pvStack_28 = result;
  ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = ReadBasicType(this,&local_2a);
    if (bVar1) {
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::push_back
                (pvStack_28,&local_2a);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,&local_52);
        if (!bVar1) {
          return false;
        }
        if (local_52 == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            return false;
          }
          bVar1 = LookChar1(this,&local_53);
          if (!bVar1) {
            return false;
          }
          if (local_53 == end_symbol) break;
        }
        if (local_52 != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = ReadBasicType(this,&local_56);
        if (!bVar1) break;
        ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::push_back
                  (pvStack_28,&local_56);
      }
      bVar1 = ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::empty
                        (pvStack_28);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_78,"Empty array.\n",&local_79);
        PushError(this,&local_78);
        ::std::__cxx11::string::~string((string *)&local_78);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)local_50,"Not starting with the value of requested type.\n",&local_51);
      PushError(this,(string *)local_50);
      ::std::__cxx11::string::~string((string *)local_50);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}